

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_string.c
# Opt level: O2

ssize_t mpt_encode_string(mpt_encode_state *info,iovec *to,iovec *from)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  ulong uVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong __n;
  char *__s;
  long lVar13;
  ssize_t sStack_70;
  iovec tmp;
  
  if (to == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
LAB_001109a1:
    sStack_70 = 0;
  }
  else {
    sVar4 = info->done;
    __n = info->scratch;
    uVar2 = sVar4 + __n;
    uVar9 = to->iov_len;
    if (uVar9 < uVar2) {
      return -1;
    }
    pvVar5 = to->iov_base;
    if (from == (iovec *)0x0) {
      if (__n == 0) {
        if (uVar9 != uVar2) {
          *(char *)((long)pvVar5 + uVar2) = (char)info->_ctx;
          __n = 1;
          goto LAB_00110a3e;
        }
      }
      else if (__n <= uVar9 - uVar2) {
        memcpy((void *)(sVar4 + (long)pvVar5),(void *)((long)pvVar5 + uVar2),__n);
LAB_00110a3e:
        info->done = __n + uVar2;
        goto LAB_001109a1;
      }
    }
    else {
      uVar6 = from->iov_len;
      if (uVar6 == 0) {
        return -1;
      }
      __s = (char *)from->iov_base;
      if (__s == (char *)0x0) {
        if (uVar2 == 0) {
          return -0x10;
        }
        tmp.iov_len = uVar2 - (*(char *)((long)pvVar5 + (uVar2 - 1)) == '\0');
        lVar13 = uVar6 + 1;
        do {
          lVar13 = lVar13 + -1;
          if (lVar13 == 0) {
            info->done = info->done - tmp.iov_len;
            return tmp.iov_len;
          }
          tmp.iov_base = pvVar5;
          tmp.iov_len = mpt_memrchr(&tmp,1,(int)info->_ctx);
        } while (-1 < (long)tmp.iov_len);
        return -0x10;
      }
      uVar9 = uVar9 - uVar2;
      if (uVar9 != 0) {
        if (uVar6 < uVar9) {
          uVar9 = uVar6;
        }
        if (__n == 0) {
          pvVar7 = memchr(__s,(int)info->_ctx,uVar9);
          if (pvVar7 != (void *)0x0) {
            return -8;
          }
        }
        else {
          pcVar3 = (char *)((long)pvVar5 + uVar2);
          lVar13 = 1 - uVar6;
          if (uVar2 < uVar6) {
            lVar13 = -uVar2;
          }
          pcVar8 = pcVar3 + (lVar13 - uVar6);
          while (lVar13 < (long)(uVar9 - uVar6)) {
            if (lVar13 == 0) {
              pcVar8 = __s;
            }
            lVar1 = lVar13 + 1;
            if (*pcVar8 == *pcVar3) {
              lVar12 = 1;
              pcVar10 = pcVar8;
              while (lVar11 = lVar1, lVar13 < (long)(lVar1 + uVar6)) {
                pcVar10 = pcVar10 + 1;
                if (lVar13 + lVar12 == 0) {
                  pcVar10 = __s;
                }
                lVar11 = lVar13 + lVar12;
                if (*pcVar10 != pcVar3[lVar12]) break;
                lVar12 = lVar12 + 1;
              }
              if (lVar11 == lVar1 + uVar6) {
                return -3;
              }
            }
            pcVar8 = pcVar8 + 1;
            lVar13 = lVar1;
          }
          memmove(pcVar3 + (uVar9 - __n),(void *)((long)pvVar5 + sVar4),__n);
          __s = (char *)from->iov_base;
        }
        memcpy((void *)((long)pvVar5 + sVar4),__s,uVar9);
        info->done = uVar2 + uVar9;
        return uVar9;
      }
    }
    sStack_70 = -0x11;
  }
  return sStack_70;
}

Assistant:

extern ssize_t mpt_encode_string(MPT_STRUCT(encode_state) *info, const struct iovec *to, const struct iovec *from)
{
	uint8_t *base;
	size_t sep, len, off, max;
	
	if (!to) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	sep = info->scratch;
	off = info->done + info->scratch;
	
	base = to->iov_base;
	max  = to->iov_len;
	
	if (off > max) {
		return -1;
	}
	/* terminate string */
	if (!from) {
		max -= off;
		
		if (!sep) {
			if (!max) {
				return MPT_ERROR(MissingBuffer);
			}
			base[off++] = info->_ctx;
		}
		else if (max < sep) {
			return MPT_ERROR(MissingBuffer);
		}
		else {
			base += off;
			memcpy(base-sep, base, sep);
			off += sep;
		}
		info->done = off;
		
		/* push delimiter data */
		return 0;
	}
	/* start priority data */
	if (!(len = from->iov_len)) {
		return MPT_ERROR(BadArgument);
	}
	/* delete buffered data */
	if (!from->iov_base) {
		/* no data available */
		if (!off) {
			return MPT_ERROR(MissingData);
		}
		/* no active message, remove endbyte */
		if (!(base)[off-1]) {
			--off;
		}
		while (len--) {
			struct iovec tmp;
			ssize_t pos;
			
			tmp.iov_base = base;
			tmp.iov_len  = off;
			
			/* find message separator */
			if ((pos = mpt_memrchr(&tmp, 1, info->_ctx)) >= 0) {
				off = pos;
				continue;
			}
			return MPT_ERROR(MissingData);
		}
		info->done -= off;
		
		return off;
	}
	if (!(max -= off)) {
		return MPT_ERROR(MissingBuffer);
	}
	base += off;
	if (len < max) {
		max = from->iov_len;
	}
	/* invalid data */
	if (len) {
		if (!sep) {
			if (max && memchr(from->iov_base, info->_ctx, max)) {
				return MPT_ERROR(BadEncoding);
			}
		}
		/* check longer separator pattern */
		else {
			const uint8_t *cmp = base, *val;
			ssize_t i, total;
			
			/* relative compare start position */
			i = (off < len) ? -off : 1 - len;
			
			total = max - len;
			for (val = base - len + i; i < total; ++i, ++val) {
				const uint8_t *v2, *c2;
				ssize_t j, k;
				if (!i) val = from->iov_base;
				if (*val != *cmp) continue;
				v2 = val + 1;
				c2 = cmp + 1;
				for (j = i+1, k = j+len; i < k; ++j) {
					if (!j) v2 = from->iov_base;
					if (*(v2++) != *(c2++)) {
						break;
					}
				}
				if (j == k) {
					return -3;
				}
			}
			/* move delimiter string */
			memmove(base+max-sep, base-sep, sep);
		}
	}
	else if (memchr(from->iov_base, info->_ctx, max)) {
		return MPT_ERROR(BadEncoding);
	}
	/* copy source data */
	memcpy(base-sep, from->iov_base, max);
	off += max;
	
	info->done = off;
	
	return max;
}